

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_sameName(ENCODING *enc,char *ptr1,char *ptr2)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  
LAB_00152d9b:
  bVar3 = *ptr1;
  pbVar4 = (byte *)ptr2;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)bVar3)) {
  case 5:
    goto switchD_00152db7_caseD_5;
  case 6:
    goto switchD_00152db7_caseD_6;
  case 7:
    if (bVar3 != *ptr2) {
      return 0;
    }
    ptr2 = (char *)((byte *)ptr2 + 1);
    bVar3 = ((byte *)ptr1)[1];
    ptr1 = (char *)((byte *)ptr1 + 1);
    goto switchD_00152db7_caseD_6;
  default:
    if (bVar3 == *ptr2) {
      return 1;
    }
    bVar3 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr2) - 5;
    if (0x18 < bVar3) {
      return 1;
    }
    return *(int *)(&DAT_001ca590 + (ulong)bVar3 * 4);
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1d:
    break;
  }
  ptr1 = (char *)((byte *)ptr1 + 1);
  bVar2 = *ptr2;
  ptr2 = (char *)((byte *)ptr2 + 1);
  if (bVar2 != bVar3) {
    return 0;
  }
  goto LAB_00152d9b;
switchD_00152db7_caseD_6:
  if (bVar3 != *ptr2) {
    return 0;
  }
  pbVar4 = (byte *)ptr2 + 1;
  bVar3 = ((byte *)ptr1)[1];
  ptr1 = (char *)((byte *)ptr1 + 1);
switchD_00152db7_caseD_5:
  if (bVar3 == *pbVar4) {
    pbVar1 = (byte *)ptr1 + 1;
    ptr1 = (char *)((byte *)ptr1 + 2);
    ptr2 = (char *)(pbVar4 + 2);
    if (*pbVar1 == pbVar4[1]) goto LAB_00152d9b;
  }
  return 0;
}

Assistant:

static
int PREFIX(sameName)(const ENCODING *enc, const char *ptr1, const char *ptr2)
{
  for (;;) {
    switch (BYTE_TYPE(enc, ptr1)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (*ptr1++ != *ptr2++) \
        return 0;
    LEAD_CASE(4) LEAD_CASE(3) LEAD_CASE(2)
#undef LEAD_CASE
      /* fall through */
      if (*ptr1++ != *ptr2++)
        return 0;
      break;
    case BT_NONASCII:
    case BT_NMSTRT:
#ifdef XML_NS
    case BT_COLON:
#endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      if (*ptr2++ != *ptr1++)
        return 0;
      if (MINBPC(enc) > 1) {
        if (*ptr2++ != *ptr1++)
          return 0;
        if (MINBPC(enc) > 2) {
          if (*ptr2++ != *ptr1++)
            return 0;
          if (MINBPC(enc) > 3) {
            if (*ptr2++ != *ptr1++)
              return 0;
          }
        }
      }
      break;
    default:
      if (MINBPC(enc) == 1 && *ptr1 == *ptr2)
        return 1;
      switch (BYTE_TYPE(enc, ptr2)) {
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
      case BT_NONASCII:
      case BT_NMSTRT:
#ifdef XML_NS
      case BT_COLON:
#endif
      case BT_HEX:
      case BT_DIGIT:
      case BT_NAME:
      case BT_MINUS:
        return 0;
      default:
        return 1;
      }
    }
  }
  /* not reached */
}